

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::capsule::capsule<pybind11::detail::accessor_policies::generic_item>
          (capsule *this,accessor<pybind11::detail::accessor_policies::generic_item> *a)

{
  object local_20;
  accessor<pybind11::detail::accessor_policies::generic_item> *local_18;
  accessor<pybind11::detail::accessor_policies::generic_item> *a_local;
  capsule *this_local;
  
  local_18 = a;
  a_local = (accessor<pybind11::detail::accessor_policies::generic_item> *)this;
  detail::accessor::operator_cast_to_object((accessor *)&local_20);
  capsule(this,&local_20);
  object::~object(&local_20);
  return;
}

Assistant:

capsule(PyObject *ptr, bool is_borrowed)
        : object(is_borrowed ? object(ptr, borrowed_t{}) : object(ptr, stolen_t{})) {}